

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float64 float64_div_aarch64(float64 a,float64 b,float_status *s)

{
  int iVar1;
  int iVar2;
  float64 fVar3;
  double dVar4;
  
  if (((s->float_exception_flags & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    if (s->flush_inputs_to_zero != '\0') {
      if ((a & 0x7fffffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0) {
        a = a & 0x8000000000000000;
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
      if ((b & 0x7fffffffffffffff) != 0 && (b & 0x7ff0000000000000) == 0) {
        b = b & 0x8000000000000000;
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
    }
    iVar1 = __fpclassify((double)a);
    if ((iVar1 == 4) || (iVar1 == 2)) {
      iVar2 = __fpclassify((double)b);
      if (iVar2 == 4) {
        dVar4 = (double)a / (double)b;
        if (ABS(dVar4) == INFINITY) {
          s->float_exception_flags = s->float_exception_flags | 8;
        }
        else if ((ABS(dVar4) <= 2.2250738585072014e-308) && (iVar1 != 2)) goto LAB_005e6583;
        return (float64)dVar4;
      }
    }
  }
LAB_005e6583:
  fVar3 = soft_f64_div(a,b,s);
  return fVar3;
}

Assistant:

float64 QEMU_FLATTEN
float64_div(float64 a, float64 b, float_status *s)
{
    return float64_gen2(a, b, s, hard_f64_div, soft_f64_div,
                        f64_div_pre, f64_div_post, NULL, NULL);
}